

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

IGUIFont * __thiscall irr::gui::CGUIEnvironment::getFont(CGUIEnvironment *this,path *filename)

{
  array<irr::gui::CGUIEnvironment::SFont> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  CGUIFont *this_01;
  double __x;
  SFont f;
  SFont local_78;
  
  paVar1 = &local_78.NamedPath.Path.str.field_2;
  local_78.NamedPath.Path.str._M_string_length = 0;
  local_78.NamedPath.Path.str.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_78.NamedPath.InternalName.str.field_2;
  local_78.NamedPath.InternalName.str._M_string_length = 0;
  local_78.NamedPath.InternalName.str.field_2._M_local_buf[0] = '\0';
  local_78.NamedPath.Path.str._M_dataplus._M_p = (pointer)paVar1;
  local_78.NamedPath.InternalName.str._M_dataplus._M_p = (pointer)paVar2;
  irr::io::SNamedPath::setPath(&local_78.NamedPath,filename);
  this_00 = &this->Fonts;
  core::array<irr::gui::CGUIEnvironment::SFont>::sort(this_00);
  uVar6 = core::array<irr::gui::CGUIEnvironment::SFont>::binary_search
                    (this_00,&local_78,0,
                     (int)((ulong)((long)(this->Fonts).m_data.
                                         super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->Fonts).m_data.
                                        super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x38e38e39 + -1);
  if (uVar6 == 0xffffffff) {
    iVar7 = (*this->FileSystem->_vptr_IFileSystem[0x1b])(this->FileSystem,filename);
    if ((char)iVar7 == '\0') {
      os::Printer::log(__x);
    }
    else {
      this_01 = (CGUIFont *)operator_new(0xb8);
      CGUIFont::CGUIFont(this_01,&this->super_IGUIEnvironment,(path *)&local_78);
      bVar5 = CGUIFont::load(this_01,(path *)&local_78);
      if (bVar5) {
        local_78.Font = (IGUIFont *)this_01;
        std::
        vector<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
        ::push_back(&this_00->m_data,&local_78);
        (this->Fonts).is_sorted = false;
        goto LAB_0021ae57;
      }
      lVar4 = *(long *)(*(long *)this_01 + -0x18);
      piVar3 = (int *)((long)&(this_01->Areas).m_data.
                              super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
                              ._M_impl.super__Vector_impl_data._M_finish + lVar4);
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        (**(code **)(*(long *)(&this_01->field_0x0 + lVar4) + 8))(&this_01->field_0x0 + lVar4);
      }
    }
    this_01 = (CGUIFont *)0x0;
  }
  else {
    this_01 = (CGUIFont *)
              (this_00->m_data).
              super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar6].Font;
  }
LAB_0021ae57:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.NamedPath.InternalName.str._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.NamedPath.InternalName.str._M_dataplus._M_p,
                    CONCAT71(local_78.NamedPath.InternalName.str.field_2._M_allocated_capacity._1_7_
                             ,local_78.NamedPath.InternalName.str.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.NamedPath.Path.str._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.NamedPath.Path.str._M_dataplus._M_p,
                    CONCAT71(local_78.NamedPath.Path.str.field_2._M_allocated_capacity._1_7_,
                             local_78.NamedPath.Path.str.field_2._M_local_buf[0]) + 1);
  }
  return (IGUIFont *)this_01;
}

Assistant:

IGUIFont *CGUIEnvironment::getFont(const io::path &filename)
{
	// search existing font

	SFont f;
	f.NamedPath.setPath(filename);

	s32 index = Fonts.binary_search(f);
	if (index != -1)
		return Fonts[index].Font;

	// font doesn't exist, attempt to load it

	// does the file exist?

	if (!FileSystem->existFile(filename)) {
		os::Printer::log("Could not load font because the file does not exist", f.NamedPath.getPath(), ELL_ERROR);
		return 0;
	}

	IGUIFont *ifont = 0;
#if 0
		{
			CGUIFont* font = new CGUIFont(this, filename);
			ifont = (IGUIFont*)font;

			// load the font
			io::path directory;
			core::splitFilename(filename, &directory);
			if (!font->load(xml, directory))
			{
				font->drop();
				font  = 0;
				ifont = 0;
			}
		}
#endif

	if (!ifont) {

		CGUIFont *font = new CGUIFont(this, f.NamedPath.getPath());
		ifont = (IGUIFont *)font;
		if (!font->load(f.NamedPath.getPath())) {
			font->drop();
			return 0;
		}
	}

	// add to fonts.

	f.Font = ifont;
	Fonts.push_back(f);

	return ifont;
}